

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::keyPressEvent(QWidget *this,QKeyEvent *event)

{
  WindowType WVar1;
  uint uVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QWidget *in_RSI;
  QWidget *in_RDI;
  
  WVar1 = windowType(in_RSI);
  if (WVar1 == Popup) {
    __fd = 0x46;
    uVar2 = QKeyEvent::matches((StandardKey)in_RSI);
    if ((uVar2 & 1) != 0) {
      QEvent::accept((QEvent *)in_RSI,__fd,__addr,in_RCX);
      close(in_RDI,__fd);
      return;
    }
  }
  QEvent::ignore((QEvent *)in_RSI);
  return;
}

Assistant:

void QWidget::keyPressEvent(QKeyEvent *event)
{
#ifndef QT_NO_SHORTCUT
    if ((windowType() == Qt::Popup) && event->matches(QKeySequence::Cancel)) {
        event->accept();
        close();
    } else
#endif
    {
        event->ignore();
    }
}